

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O2

int PHYSFS_enumerate(char *_fn,PHYSFS_EnumerateCallback cb,void *data)

{
  DirHandle *h;
  void *pvVar1;
  _func_int_void_ptr_char_ptr_PHYSFS_Stat_ptr *p_Var2;
  PHYSFS_Archiver *pPVar3;
  void *pvVar4;
  _func_PHYSFS_EnumerateCallbackResult_void_ptr_char_ptr_PHYSFS_EnumerateCallback_char_ptr_void_ptr
  *p_Var5;
  undefined8 uVar6;
  char *pcVar7;
  char *pcVar8;
  int iVar9;
  PHYSFS_EnumerateCallbackResult PVar10;
  PHYSFS_ErrorCode PVar11;
  size_t sVar12;
  char *dst;
  ulong uVar13;
  undefined8 *puVar14;
  undefined1 *puVar15;
  undefined1 *ptr;
  DirHandle **ppDVar16;
  uint uVar17;
  undefined8 uStack_a0;
  undefined1 local_98 [8];
  PHYSFS_Stat statbuf;
  char *local_48;
  char *arcfname;
  void *local_38;
  
  puVar15 = local_98;
  if ((_fn == (char *)0x0) || (cb == (PHYSFS_EnumerateCallback)0x0)) {
    puVar14 = &uStack_a0;
    uStack_a0 = 9;
  }
  else {
    uStack_a0 = 0x107e41;
    sVar12 = strlen(_fn);
    if (sVar12 + 1 < 0x100) {
      puVar15 = local_98 + -(sVar12 + 0x18 & 0xfffffffffffffff0);
      ptr = puVar15;
    }
    else {
      ptr = (undefined1 *)0x0;
    }
    *(undefined8 *)(puVar15 + -8) = 0x107e85;
    dst = (char *)__PHYSFS_initSmallAlloc(ptr,sVar12 + 1);
    if (dst != (char *)0x0) {
      *(undefined8 *)(puVar15 + -8) = 0x107e9c;
      iVar9 = sanitizePlatformIndependentPath(_fn,dst);
      if (iVar9 == 0) {
        *(undefined8 *)(puVar15 + -8) = 1;
        uVar17 = (uint)*(undefined8 *)(puVar15 + -8);
      }
      else {
        *(undefined8 *)(puVar15 + -8) = 0x107eb0;
        __PHYSFS_platformGrabMutex(stateLock);
        if (allowSymLinks == 0) {
          statbuf._32_8_ = cb;
        }
        arcfname = (char *)cb;
        *(undefined8 *)(puVar15 + -8) = 1;
        uVar13 = *(ulong *)(puVar15 + -8);
        ppDVar16 = &searchPath;
        local_38 = data;
        while (((int)uVar13 == 1 && (h = *ppDVar16, h != (DirHandle *)0x0))) {
          local_48 = dst;
          *(undefined8 *)(puVar15 + -8) = 0x107f04;
          iVar9 = partOfMountPoint(h,dst);
          pcVar7 = arcfname;
          if (iVar9 == 0) {
            *(undefined8 *)(puVar15 + -8) = 0x107f2c;
            iVar9 = verifyPath(h,&local_48,0);
            *(undefined8 *)(puVar15 + -8) = 1;
            pcVar7 = local_48;
            uVar13 = *(ulong *)(puVar15 + -8);
            if (iVar9 != 0) {
              pvVar1 = h->opaque;
              p_Var2 = h->funcs->stat;
              *(undefined8 *)(puVar15 + -8) = 0x107f4c;
              iVar9 = (*p_Var2)(pvVar1,pcVar7,(PHYSFS_Stat *)local_98);
              if (iVar9 == 0) {
                *(undefined8 *)(puVar15 + -8) = 0x107f55;
                PVar11 = currentErrorCode();
                data = local_38;
                if (PVar11 == PHYSFS_ERR_NOT_FOUND) goto LAB_00107f88;
              }
              pvVar1 = local_38;
              pcVar8 = arcfname;
              data = local_38;
              if ((int)statbuf.accesstime == 1) {
                pPVar3 = h->funcs;
                if ((allowSymLinks == 0) && ((pPVar3->info).supportsSymlinks != 0)) {
                  pvVar1 = h->opaque;
                  p_Var5 = pPVar3->enumerate;
                  *(undefined8 *)(puVar15 + -8) = 0x107fbb;
                  PVar10 = (*p_Var5)(pvVar1,pcVar7,enumCallbackFilterSymLinks,_fn,&statbuf.filetype)
                  ;
                  uVar13 = (ulong)(uint)PVar10;
                  data = local_38;
                  if (PVar10 == PHYSFS_ENUM_ERROR) {
                    *(undefined8 *)(puVar15 + -8) = 0x107fc7;
                    PVar11 = currentErrorCode();
                    *(undefined8 *)(puVar15 + -8) = 0xffffffffffffffff;
                    uVar13 = *(ulong *)(puVar15 + -8);
                    data = local_38;
                    if (PVar11 == PHYSFS_ERR_APP_CALLBACK) {
                      *(undefined8 *)(puVar15 + -8) = 0x107fd7;
                      PHYSFS_setErrorCode(PHYSFS_ERR_OK);
                      data = local_38;
                    }
                  }
                }
                else {
                  pvVar4 = h->opaque;
                  p_Var5 = pPVar3->enumerate;
                  *(undefined8 *)(puVar15 + -8) = 0x107f82;
                  PVar10 = (*p_Var5)(pvVar4,pcVar7,(PHYSFS_EnumerateCallback)pcVar8,_fn,pvVar1);
                  uVar13 = (ulong)(uint)PVar10;
                  data = local_38;
                }
              }
            }
          }
          else {
            *(undefined8 *)(puVar15 + -8) = 0x107f1d;
            PVar10 = enumerateFromMountPoint(h,dst,(PHYSFS_EnumerateCallback)pcVar7,_fn,data);
            uVar13 = (ulong)(uint)PVar10;
          }
LAB_00107f88:
          ppDVar16 = &h->next;
        }
        *(undefined8 *)(puVar15 + -8) = 0x107fe5;
        __PHYSFS_platformReleaseMutex(stateLock);
        uVar17 = (uint)((int)uVar13 != -1);
      }
      if (*(long *)(dst + -8) == 0) {
        return uVar17;
      }
      *(undefined8 *)(puVar15 + -8) = 0x108015;
      (*__PHYSFS_AllocatorHooks.Free)(dst + -8);
      return uVar17;
    }
    puVar14 = (undefined8 *)(puVar15 + -8);
    *(undefined8 *)(puVar15 + -8) = 2;
  }
  uVar6 = *puVar14;
  *puVar14 = 0x107e69;
  PHYSFS_setErrorCode((PHYSFS_ErrorCode)uVar6);
  return 0;
}

Assistant:

int PHYSFS_enumerate(const char *_fn, PHYSFS_EnumerateCallback cb, void *data)
{
    PHYSFS_EnumerateCallbackResult retval = PHYSFS_ENUM_OK;
    size_t len;
    char *fname;

    BAIL_IF(!_fn, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    BAIL_IF(!cb, PHYSFS_ERR_INVALID_ARGUMENT, 0);

    len = strlen(_fn) + 1;
    fname = (char *) __PHYSFS_smallAlloc(len);
    BAIL_IF(!fname, PHYSFS_ERR_OUT_OF_MEMORY, 0);

    if (!sanitizePlatformIndependentPath(_fn, fname))
        retval = PHYSFS_ENUM_STOP;
    else
    {
        DirHandle *i;
        SymlinkFilterData filterdata;

        __PHYSFS_platformGrabMutex(stateLock);

        if (!allowSymLinks)
        {
            memset(&filterdata, '\0', sizeof (filterdata));
            filterdata.callback = cb;
            filterdata.callbackData = data;
        } /* if */

        for (i = searchPath; (retval == PHYSFS_ENUM_OK) && i; i = i->next)
        {
            char *arcfname = fname;

            if (partOfMountPoint(i, arcfname))
                retval = enumerateFromMountPoint(i, arcfname, cb, _fn, data);

            else if (verifyPath(i, &arcfname, 0))
            {
                PHYSFS_Stat statbuf;
                if (!i->funcs->stat(i->opaque, arcfname, &statbuf))
                {
                    if (currentErrorCode() == PHYSFS_ERR_NOT_FOUND)
                        continue;  /* no such dir in this archive, skip it. */
                } /* if */

                if (statbuf.filetype != PHYSFS_FILETYPE_DIRECTORY)
                    continue;  /* not a directory in this archive, skip it. */

                else if ((!allowSymLinks) && (i->funcs->info.supportsSymlinks))
                {
                    filterdata.dirhandle = i;
                    filterdata.arcfname = arcfname;
                    filterdata.errcode = PHYSFS_ERR_OK;
                    retval = i->funcs->enumerate(i->opaque, arcfname,
                                                 enumCallbackFilterSymLinks,
                                                 _fn, &filterdata);
                    if (retval == PHYSFS_ENUM_ERROR)
                    {
                        if (currentErrorCode() == PHYSFS_ERR_APP_CALLBACK)
                            PHYSFS_setErrorCode(filterdata.errcode);
                    } /* if */
                } /* else if */
                else
                {
                    retval = i->funcs->enumerate(i->opaque, arcfname,
                                                 cb, _fn, data);
                } /* else */
            } /* else if */
        } /* for */

        __PHYSFS_platformReleaseMutex(stateLock);
    } /* if */

    __PHYSFS_smallFree(fname);

    return (retval == PHYSFS_ENUM_ERROR) ? 0 : 1;
}